

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

Var __thiscall Js::JavascriptStackWalker::GetThisFromFrame(JavascriptStackWalker *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptFunction *pJVar5;
  void **ppvVar6;
  JavascriptGenerator *pJVar7;
  Var pvVar8;
  
  if ((this->field_0x50 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45b,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
    if (!bVar3) goto LAB_00afaae8;
    *puVar4 = 0;
  }
  if (((*(ushort *)&this->field_0x50 >> 2 | *(ushort *)&this->field_0x50) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45c,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar3) {
LAB_00afaae8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pJVar5 = GetCurrentFunction(this,true);
  TVar1 = ((pJVar5->functionInfo).ptr)->attributes;
  ppvVar6 = GetCurrentArgv(this);
  if ((TVar1 & (Async|Generator)) != None) {
    pJVar7 = VarTo<Js::JavascriptGenerator>(ppvVar6[2]);
    pvVar8 = Arguments::operator[](&pJVar7->args,0);
    return pvVar8;
  }
  return ppvVar6[2];
}

Assistant:

Var JavascriptStackWalker::GetThisFromFrame() const
    {
        Assert(!inlinedFramesBeingWalked);
        Assert(this->IsJavascriptFrame());

        if (this->GetCurrentFunction()->GetFunctionInfo()->IsCoroutine())
        {
            JavascriptGenerator* gen = VarTo<JavascriptGenerator>(this->GetCurrentArgv()[JavascriptFunctionArgIndex_This]);
            return gen->GetArguments()[0];
        }

        return this->GetCurrentArgv()[JavascriptFunctionArgIndex_This];
    }